

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O0

size_t absl::lts_20240722::container_internal::anon_unknown_1::RandomSeed(void)

{
  ulong uVar1;
  ulong *puVar2;
  ulong uVar3;
  size_t value;
  
  puVar2 = (ulong *)__tls_get_addr(&PTR_0010efc0);
  uVar1 = *puVar2;
  *puVar2 = uVar1 + 1;
  uVar3 = __tls_get_addr(&PTR_0010efc0);
  return uVar1 + 1 ^ uVar3;
}

Assistant:

inline size_t RandomSeed() {
#ifdef ABSL_HAVE_THREAD_LOCAL
  static thread_local size_t counter = 0;
  // On Linux kernels >= 5.4 the MSAN runtime has a false-positive when
  // accessing thread local storage data from loaded libraries
  // (https://github.com/google/sanitizers/issues/1265), for this reason counter
  // needs to be annotated as initialized.
  ABSL_ANNOTATE_MEMORY_IS_INITIALIZED(&counter, sizeof(size_t));
  size_t value = ++counter;
#else   // ABSL_HAVE_THREAD_LOCAL
  static std::atomic<size_t> counter(0);
  size_t value = counter.fetch_add(1, std::memory_order_relaxed);
#endif  // ABSL_HAVE_THREAD_LOCAL
  return value ^ static_cast<size_t>(reinterpret_cast<uintptr_t>(&counter));
}